

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O3

AnalyzedScope * __thiscall
slang::analysis::AnalysisManager::getAnalyzedScope(AnalysisManager *this,Scope *scope)

{
  group_type_pointer pgVar1;
  uint uVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  group_access_pointer pgVar5;
  undefined1 auVar6 [16];
  __int_type_conflict _Var7;
  __int_type_conflict _Var8;
  __int_type_conflict _Var9;
  __int_type_conflict _Var10;
  ulong uVar11;
  AnalyzedScope *pAVar12;
  ulong uVar13;
  ulong uVar14;
  uint k;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long in_FS_OFFSET;
  bool bVar21;
  undefined1 auVar22 [16];
  
  if (*(char *)(in_FS_OFFSET + -0x10) == '\0') {
    LOCK();
    UNLOCK();
    uVar13 = (ulong)((int)boost::unordered::detail::foa::
                          concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
                          ::thread_counter + 1U & 0x7f);
    boost::unordered::detail::foa::
    concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
    ::thread_counter =
         boost::unordered::detail::foa::
         concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
         ::thread_counter + 1;
    *(ulong *)(in_FS_OFFSET + -0x18) = uVar13;
    *(undefined1 *)(in_FS_OFFSET + -0x10) = 1;
  }
  else {
    uVar13 = *(ulong *)(in_FS_OFFSET + -0x18);
  }
  uVar14 = (ulong)((this->analyzedScopes).table_.mutexes.mutexes.buf + 0x3f) & 0xffffffffffffffc0;
  lVar18 = uVar13 * 0x40;
  uVar15 = 0;
  do {
    uVar16 = *(uint *)(lVar18 + uVar14);
    if (uVar16 < 0x3fffffff) {
      LOCK();
      bVar21 = uVar16 == *(uint *)(lVar18 + uVar14);
      if (bVar21) {
        *(uint *)(lVar18 + uVar14) = uVar16 + 1;
      }
      UNLOCK();
      if (bVar21) break;
    }
    boost::unordered::detail::foa::rw_spinlock::yield(uVar15);
    uVar15 = uVar15 + 1;
  } while( true );
  auVar6._8_8_ = 0;
  auVar6._0_8_ = scope;
  uVar13 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar19 = uVar13 >> ((byte)(this->analyzedScopes).table_.
                            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .arrays.
                            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .groups_size_index & 0x3f);
  lVar20 = (uVar13 & 0xff) * 4;
  _Var7 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
          match_word(unsigned_long)::word[lVar20 + 0xc];
  _Var8 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
          match_word(unsigned_long)::word[lVar20 + 0xd];
  _Var9 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
          match_word(unsigned_long)::word[lVar20 + 0xe];
  _Var10 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar20 + 0xf];
  uVar17 = 0;
LAB_001422b0:
  pgVar3 = (this->analyzedScopes).table_.
           super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .arrays.
           super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .groups_;
  pgVar1 = pgVar3 + uVar19;
  auVar22[0] = -(pgVar1->m[0].n.super___atomic_base<unsigned_char>._M_i == _Var7);
  auVar22[1] = -(pgVar1->m[1].n.super___atomic_base<unsigned_char>._M_i == _Var8);
  auVar22[2] = -(pgVar1->m[2].n.super___atomic_base<unsigned_char>._M_i == _Var9);
  auVar22[3] = -(pgVar1->m[3].n.super___atomic_base<unsigned_char>._M_i == _Var10);
  auVar22[4] = -(pgVar1->m[4].n.super___atomic_base<unsigned_char>._M_i == _Var7);
  auVar22[5] = -(pgVar1->m[5].n.super___atomic_base<unsigned_char>._M_i == _Var8);
  auVar22[6] = -(pgVar1->m[6].n.super___atomic_base<unsigned_char>._M_i == _Var9);
  auVar22[7] = -(pgVar1->m[7].n.super___atomic_base<unsigned_char>._M_i == _Var10);
  auVar22[8] = -(pgVar1->m[8].n.super___atomic_base<unsigned_char>._M_i == _Var7);
  auVar22[9] = -(pgVar1->m[9].n.super___atomic_base<unsigned_char>._M_i == _Var8);
  auVar22[10] = -(pgVar1->m[10].n.super___atomic_base<unsigned_char>._M_i == _Var9);
  auVar22[0xb] = -(pgVar1->m[0xb].n.super___atomic_base<unsigned_char>._M_i == _Var10);
  auVar22[0xc] = -(pgVar1->m[0xc].n.super___atomic_base<unsigned_char>._M_i == _Var7);
  auVar22[0xd] = -(pgVar1->m[0xd].n.super___atomic_base<unsigned_char>._M_i == _Var8);
  auVar22[0xe] = -(pgVar1->m[0xe].n.super___atomic_base<unsigned_char>._M_i == _Var9);
  auVar22[0xf] = -(pgVar1->m[0xf].n.super___atomic_base<unsigned_char>._M_i == _Var10);
  uVar15 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
  if (uVar15 != 0) {
    ppVar4 = (this->analyzedScopes).table_.
             super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .arrays.
             super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .elements_;
    pgVar5 = (this->analyzedScopes).table_.
             super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .arrays.group_accesses_;
    uVar16 = 0;
    do {
      uVar2 = pgVar5[uVar19].m.state_.super___atomic_base<unsigned_int>._M_i;
      if (uVar2 < 0x3fffffff) {
        LOCK();
        bVar21 = uVar2 == pgVar5[uVar19].m.state_.super___atomic_base<unsigned_int>._M_i;
        if (bVar21) {
          pgVar5[uVar19].m.state_.super___atomic_base<unsigned_int>._M_i = uVar2 + 1;
        }
        UNLOCK();
        if (bVar21) goto LAB_0014233c;
      }
      boost::unordered::detail::foa::rw_spinlock::yield(uVar16);
      uVar16 = uVar16 + 1;
    } while( true );
  }
  goto LAB_0014238a;
  while (uVar15 = uVar15 - 1 & uVar15, uVar15 != 0) {
LAB_0014233c:
    uVar16 = 0;
    if (uVar15 != 0) {
      for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    uVar11 = (ulong)uVar16;
    if ((pgVar3[uVar19].m[uVar11].n.super___atomic_base<unsigned_char>._M_i != '\0') &&
       (ppVar4[uVar19 * 0xf + uVar11].first == scope)) {
      if (ppVar4[uVar19 * 0xf + uVar11].second.
          super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>._M_payload.
          super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>._M_engaged == false)
      {
        pAVar12 = (AnalyzedScope *)0x0;
      }
      else {
        pAVar12 = ppVar4[uVar19 * 0xf + uVar11].second.
                  super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>.
                  _M_payload.super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>.
                  _M_payload._M_value;
      }
      LOCK();
      pgVar5[uVar19].m.state_.super___atomic_base<unsigned_int>._M_i =
           pgVar5[uVar19].m.state_.super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
      goto LAB_001423c5;
    }
  }
  LOCK();
  pgVar5[uVar19].m.state_.super___atomic_base<unsigned_int>._M_i =
       pgVar5[uVar19].m.state_.super___atomic_base<unsigned_int>._M_i - 1;
  UNLOCK();
LAB_0014238a:
  pAVar12 = (AnalyzedScope *)0x0;
  if ((*(byte *)((long)&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::atomic_integral>::
                        is_not_overflowed(unsigned_long)::shift + (ulong)((uint)uVar13 & 7)) &
      pgVar3[uVar19].m[0xf].n.super___atomic_base<unsigned_char>._M_i) == 0) goto LAB_001423c5;
  uVar11 = (this->analyzedScopes).table_.
           super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .arrays.
           super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .groups_size_mask;
  lVar20 = uVar19 + uVar17;
  uVar17 = uVar17 + 1;
  uVar19 = lVar20 + 1U & uVar11;
  if (uVar11 < uVar17) {
LAB_001423c5:
    LOCK();
    *(int *)(lVar18 + uVar14) = *(int *)(lVar18 + uVar14) + -1;
    UNLOCK();
    return pAVar12;
  }
  goto LAB_001422b0;
}

Assistant:

const AnalyzedScope* AnalysisManager::getAnalyzedScope(const Scope& scope) {
    const AnalyzedScope* result = nullptr;
    analyzedScopes.cvisit(&scope, [&result](auto& item) {
        if (item.second)
            result = *item.second;
    });
    return result;
}